

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O0

void Assimp::BaseImporter::TextFileToBuffer
               (IOStream *stream,vector<char,_std::allocator<char>_> *data,TextFileMode mode)

{
  size_type sVar1;
  vector<char,_std::allocator<char>_> *pvVar2;
  int iVar3;
  undefined4 extraout_var;
  DeadlyImportError *pDVar4;
  reference pvVar5;
  size_type sVar6;
  value_type local_83 [2];
  allocator<char> local_81;
  string local_80;
  undefined1 local_5d;
  allocator<char> local_49;
  string local_48;
  size_type local_28;
  size_t fileSize;
  vector<char,_std::allocator<char>_> *pvStack_18;
  TextFileMode mode_local;
  vector<char,_std::allocator<char>_> *data_local;
  IOStream *stream_local;
  
  fileSize._4_4_ = mode;
  pvStack_18 = data;
  data_local = (vector<char,_std::allocator<char>_> *)stream;
  if (stream == (IOStream *)0x0) {
    __assert_fail("nullptr != stream",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/BaseImporter.cpp"
                  ,0x1c0,
                  "static void Assimp::BaseImporter::TextFileToBuffer(IOStream *, std::vector<char> &, TextFileMode)"
                 );
  }
  iVar3 = (*stream->_vptr_IOStream[6])();
  local_28 = CONCAT44(extraout_var,iVar3);
  if ((fileSize._4_4_ == FORBID_EMPTY) && (local_28 == 0)) {
    local_5d = 1;
    pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"File is empty",&local_49);
    DeadlyImportError::DeadlyImportError(pDVar4,&local_48);
    local_5d = 0;
    __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  std::vector<char,_std::allocator<char>_>::reserve(pvStack_18,local_28 + 1);
  std::vector<char,_std::allocator<char>_>::resize(pvStack_18,local_28);
  pvVar2 = data_local;
  sVar1 = local_28;
  if (local_28 != 0) {
    pvVar5 = std::vector<char,_std::allocator<char>_>::operator[](pvStack_18,0);
    sVar6 = (**(code **)(*(long *)&(pvVar2->super__Vector_base<char,_std::allocator<char>_>)._M_impl
                        + 0x10))(pvVar2,pvVar5,1,local_28);
    if (sVar1 != sVar6) {
      local_83[1] = 1;
      pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"File read error",&local_81);
      DeadlyImportError::DeadlyImportError(pDVar4,&local_80);
      local_83[1] = 0;
      __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    ConvertToUTF8(pvStack_18);
  }
  local_83[0] = '\0';
  std::vector<char,_std::allocator<char>_>::push_back(pvStack_18,local_83);
  return;
}

Assistant:

void BaseImporter::TextFileToBuffer(IOStream* stream,
    std::vector<char>& data,
    TextFileMode mode)
{
    ai_assert(nullptr != stream);

    const size_t fileSize = stream->FileSize();
    if (mode == FORBID_EMPTY) {
        if(!fileSize) {
            throw DeadlyImportError("File is empty");
        }
    }

    data.reserve(fileSize+1);
    data.resize(fileSize);
    if(fileSize > 0) {
        if(fileSize != stream->Read( &data[0], 1, fileSize)) {
            throw DeadlyImportError("File read error");
        }

        ConvertToUTF8(data);
    }

    // append a binary zero to simplify string parsing
    data.push_back(0);
}